

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall QPDFArgParser::getAllHelp(QPDFArgParser *this,ostringstream *msg)

{
  element_type *peVar1;
  ostream *poVar2;
  undefined1 local_28 [8];
  anon_class_16_2_633b96ae show;
  ostringstream *msg_local;
  QPDFArgParser *this_local;
  
  show.msg = msg;
  getTopHelp(this,msg);
  show.this = (QPDFArgParser *)show.msg;
  local_28 = (undefined1  [8])this;
  peVar1 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  getAllHelp::anon_class_16_2_633b96ae::operator()
            ((anon_class_16_2_633b96ae *)local_28,&peVar1->help_topics);
  peVar1 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  getAllHelp::anon_class_16_2_633b96ae::operator()
            ((anon_class_16_2_633b96ae *)local_28,&peVar1->option_help);
  poVar2 = (ostream *)std::ostream::operator<<(show.msg,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"====");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
QPDFArgParser::getAllHelp(std::ostringstream& msg)
{
    getTopHelp(msg);
    auto show = [this, &msg](std::map<std::string, HelpTopic>& topics) {
        for (auto const& i: topics) {
            auto const& topic = i.first;
            msg << std::endl
                << "== " << topic << " (" << i.second.short_text << ") ==" << std::endl
                << std::endl;
            getTopicHelp(topic, i.second, msg);
        }
    };
    show(m->help_topics);
    show(m->option_help);
    msg << std::endl << "====" << std::endl;
}